

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEditControl::insertFromMimeData(QTextEditControl *this,QMimeData *source)

{
  QTextEdit *pQVar1;
  undefined8 in_RSI;
  QTextEdit *ed;
  QMimeData *in_stack_00000058;
  QWidgetTextControl *in_stack_00000060;
  
  QObject::parent((QObject *)0x6d9571);
  pQVar1 = qobject_cast<QTextEdit*>((QObject *)0x6d9579);
  if (pQVar1 == (QTextEdit *)0x0) {
    QWidgetTextControl::insertFromMimeData(in_stack_00000060,in_stack_00000058);
  }
  else {
    (**(code **)(*(long *)&(pQVar1->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x1e0))
              (pQVar1,in_RSI);
  }
  return;
}

Assistant:

virtual void insertFromMimeData(const QMimeData *source) override {
        QTextEdit *ed = qobject_cast<QTextEdit *>(parent());
        if (!ed)
            QWidgetTextControl::insertFromMimeData(source);
        else
            ed->insertFromMimeData(source);
    }